

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

int __thiscall Catch::Session::run(Session *this)

{
  int iVar1;
  ostream *poVar2;
  void *this_00;
  long in_RDI;
  int exitCode;
  Session *in_stack_000002d8;
  
  if ((*(uint *)(in_RDI + 0xc0) & 1) != 0) {
    poVar2 = cout();
    poVar2 = std::operator<<(poVar2,"...waiting for enter/ return before starting");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    getchar();
  }
  iVar1 = runInternal(in_stack_000002d8);
  if ((*(uint *)(in_RDI + 0xc0) & 2) != 0) {
    poVar2 = cout();
    poVar2 = std::operator<<(poVar2,"...waiting for enter/ return before exiting, with code: ");
    this_00 = (void *)std::ostream::operator<<(poVar2,iVar1);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    getchar();
  }
  return iVar1;
}

Assistant:

int Session::run() {
        if( ( m_configData.waitForKeypress & WaitForKeypress::BeforeStart ) != 0 ) {
            Catch::cout() << "...waiting for enter/ return before starting" << std::endl;
            static_cast<void>(std::getchar());
        }
        int exitCode = runInternal();
        if( ( m_configData.waitForKeypress & WaitForKeypress::BeforeExit ) != 0 ) {
            Catch::cout() << "...waiting for enter/ return before exiting, with code: " << exitCode << std::endl;
            static_cast<void>(std::getchar());
        }
        return exitCode;
    }